

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O2

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,BinaryExpression *binary_exp,void *data)

{
  int iVar1;
  SyntaxTree *pSVar2;
  undefined4 uVar3;
  SemanticException *this_00;
  uint uVar4;
  ExpVarData r_exp_var_data;
  ExpVarData l_exp_var_data;
  
  r_exp_var_data.semantic_op_ = SemanticOp_Read;
  r_exp_var_data.exp_type_ = ExpType_Unknown;
  r_exp_var_data.results_any_count_ = false;
  pSVar2 = (binary_exp->left_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this);
  pSVar2 = (binary_exp->right_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar2->_vptr_SyntaxTree[2])(pSVar2,this,&r_exp_var_data);
  iVar1 = (binary_exp->op_token_).token_;
  uVar3 = 2;
  uVar4 = iVar1 - 0x25;
  if (uVar4 < 0x3a) {
    if ((0x200000000000561U >> ((ulong)uVar4 & 0x3f) & 1) != 0) {
      uVar3 = 3;
      if ((r_exp_var_data.exp_type_ != ExpType_Unknown) &&
         (r_exp_var_data.exp_type_ != ExpType_Number)) {
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (this_00,"right expression of binary operator is not number",
                   &binary_exp->op_token_);
        __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
      }
      goto LAB_0013781d;
    }
    if ((0x2800000UL >> ((ulong)uVar4 & 0x3f) & 1) != 0) goto LAB_0013781d;
  }
  if ((1 < iVar1 - 0x118U) && (1 < iVar1 - 0x11aU)) {
    if (iVar1 != 0x11c) {
      return;
    }
    uVar3 = 4;
  }
LAB_0013781d:
  *(undefined4 *)((long)data + 4) = uVar3;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(BinaryExpression *binary_exp, void *data)
    {
        // Binary expression is read semantic
        ExpVarData l_exp_var_data{ SemanticOp_Read };
        ExpVarData r_exp_var_data{ SemanticOp_Read };
        binary_exp->left_->Accept(this, &l_exp_var_data);
        binary_exp->right_->Accept(this, &r_exp_var_data);

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        switch (binary_exp->op_token_.token_)
        {
            case '+': case '-': case '*': case '/': case '^': case '%':
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    l_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("left expression of binary operator is not number",
                                            binary_exp->op_token_);
                if (r_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Number)
                    throw SemanticException("right expression of binary operator is not number",
                                            binary_exp->op_token_);
                parent_exp_var_data->exp_type_ = ExpType_Number;
                break;
            case '<': case '>': case Token_LessEqual: case Token_GreaterEqual:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (l_exp_var_data.exp_type_ != r_exp_var_data.exp_type_)
                        throw SemanticException("compare different expression type",
                                                binary_exp->op_token_);
                    else if (l_exp_var_data.exp_type_ != ExpType_Number &&
                             l_exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("can not compare operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_Concat:
                if (l_exp_var_data.exp_type_ != ExpType_Unknown &&
                    r_exp_var_data.exp_type_ != ExpType_Unknown)
                {
                    if (!((l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_String) ||
                          (l_exp_var_data.exp_type_ == ExpType_String &&
                           r_exp_var_data.exp_type_ == ExpType_Number) ||
                          (l_exp_var_data.exp_type_ == ExpType_Number &&
                           r_exp_var_data.exp_type_ == ExpType_String)))
                        throw SemanticException("can not concat operands",
                                                binary_exp->op_token_);
                }
                parent_exp_var_data->exp_type_ = ExpType_String;
                break;
            case Token_NotEqual: case Token_Equal:
                parent_exp_var_data->exp_type_ = ExpType_Bool;
                break;
            case Token_And: case Token_Or:
                break;
            default:
                break;
        }
    }